

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

void secp256k1_modinv64_normalize_62
               (secp256k1_modinv64_signed62 *r,int64_t sign,secp256k1_modinv64_modinfo *modinfo)

{
  int64_t *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 uStack_60;
  int64_t cond_add;
  int64_t cond_negate;
  
  lVar17 = r->v[0];
  lVar2 = r->v[1];
  lVar3 = r->v[2];
  lVar4 = r->v[3];
  lVar5 = r->v[4];
  lVar8 = 0;
  do {
    if (lVar8 == 5) {
      iVar7 = secp256k1_modinv64_mul_cmp_62(r,5,&modinfo->modulus,-2);
      if (iVar7 < 1) {
        pcVar14 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, -2) > 0";
        uStack_60 = 100;
      }
      else {
        iVar7 = secp256k1_modinv64_mul_cmp_62(r,5,&modinfo->modulus,1);
        if (iVar7 < 0) {
          uVar9 = lVar5 >> 0x3f;
          uVar10 = (modinfo->modulus).v[0];
          uVar11 = (modinfo->modulus).v[1];
          uVar12 = (modinfo->modulus).v[2];
          uVar13 = (modinfo->modulus).v[3];
          uVar6 = (modinfo->modulus).v[4];
          uVar19 = sign >> 0x3f;
          uVar15 = ((uVar9 & uVar10) + lVar17 ^ uVar19) - uVar19;
          uVar20 = ((long)uVar15 >> 0x3e) + (((uVar9 & uVar11) + lVar2 ^ uVar19) - uVar19);
          uVar18 = ((long)uVar20 >> 0x3e) + (((uVar9 & uVar12) + lVar3 ^ uVar19) - uVar19);
          uVar16 = ((long)uVar18 >> 0x3e) + (((uVar9 & uVar13) + lVar4 ^ uVar19) - uVar19);
          lVar17 = ((long)uVar16 >> 0x3e) + (((uVar9 & uVar6) + lVar5 ^ uVar19) - uVar19);
          uVar19 = lVar17 >> 0x3f;
          uVar10 = (uVar10 & uVar19) + (uVar15 & 0x3fffffffffffffff);
          uVar9 = ((long)uVar10 >> 0x3e) + (uVar11 & uVar19) + (uVar20 & 0x3fffffffffffffff);
          uVar11 = ((long)uVar9 >> 0x3e) + (uVar12 & uVar19) + (uVar18 & 0x3fffffffffffffff);
          uVar12 = ((long)uVar11 >> 0x3e) + (uVar13 & uVar19) + (uVar16 & 0x3fffffffffffffff);
          uVar13 = ((long)uVar12 >> 0x3e) + (uVar6 & uVar19) + lVar17;
          r->v[0] = uVar10 & 0x3fffffffffffffff;
          r->v[1] = uVar9 & 0x3fffffffffffffff;
          r->v[2] = uVar11 & 0x3fffffffffffffff;
          r->v[3] = uVar12 & 0x3fffffffffffffff;
          r->v[4] = uVar13;
          if (uVar13 < 0x4000000000000000) {
            iVar7 = secp256k1_modinv64_mul_cmp_62(r,5,&modinfo->modulus,0);
            if (iVar7 < 0) {
              pcVar14 = 
              "test condition failed: secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 0) >= 0"
              ;
              uStack_60 = 0x98;
            }
            else {
              iVar7 = secp256k1_modinv64_mul_cmp_62(r,5,&modinfo->modulus,1);
              if (iVar7 < 0) {
                return;
              }
              pcVar14 = 
              "test condition failed: secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 1) < 0"
              ;
              uStack_60 = 0x99;
            }
          }
          else {
            pcVar14 = "test condition failed: r4 >> 62 == 0";
            uStack_60 = 0x97;
          }
        }
        else {
          pcVar14 = 
          "test condition failed: secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 1) < 0";
          uStack_60 = 0x65;
        }
      }
      goto LAB_0012ca8d;
    }
    piVar1 = r->v + lVar8;
    if (*piVar1 < -0x3fffffffffffffff) {
      pcVar14 = "test condition failed: r->v[i] >= -M62";
      uStack_60 = 0x61;
      goto LAB_0012ca8d;
    }
    lVar8 = lVar8 + 1;
  } while (*piVar1 < 0x4000000000000000);
  pcVar14 = "test condition failed: r->v[i] <= M62";
  uStack_60 = 0x62;
LAB_0012ca8d:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
          ,uStack_60,pcVar14);
  abort();
}

Assistant:

static void secp256k1_modinv64_normalize_62(secp256k1_modinv64_signed62 *r, int64_t sign, const secp256k1_modinv64_modinfo *modinfo) {
    const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    int64_t r0 = r->v[0], r1 = r->v[1], r2 = r->v[2], r3 = r->v[3], r4 = r->v[4];
    volatile int64_t cond_add, cond_negate;

#ifdef VERIFY
    /* Verify that all limbs are in range (-2^62,2^62). */
    int i;
    for (i = 0; i < 5; ++i) {
        VERIFY_CHECK(r->v[i] >= -M62);
        VERIFY_CHECK(r->v[i] <= M62);
    }
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, -2) > 0); /* r > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 1) < 0); /* r < modulus */
#endif

    /* In a first step, add the modulus if the input is negative, and then negate if requested.
     * This brings r from range (-2*modulus,modulus) to range (-modulus,modulus). As all input
     * limbs are in range (-2^62,2^62), this cannot overflow an int64_t. Note that the right
     * shifts below are signed sign-extending shifts (see assumptions.h for tests that that is
     * indeed the behavior of the right shift operator). */
    cond_add = r4 >> 63;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    cond_negate = sign >> 63;
    r0 = (r0 ^ cond_negate) - cond_negate;
    r1 = (r1 ^ cond_negate) - cond_negate;
    r2 = (r2 ^ cond_negate) - cond_negate;
    r3 = (r3 ^ cond_negate) - cond_negate;
    r4 = (r4 ^ cond_negate) - cond_negate;
    /* Propagate the top bits, to bring limbs back to range (-2^62,2^62). */
    r1 += r0 >> 62; r0 &= M62;
    r2 += r1 >> 62; r1 &= M62;
    r3 += r2 >> 62; r2 &= M62;
    r4 += r3 >> 62; r3 &= M62;

    /* In a second step add the modulus again if the result is still negative, bringing
     * r to range [0,modulus). */
    cond_add = r4 >> 63;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    /* And propagate again. */
    r1 += r0 >> 62; r0 &= M62;
    r2 += r1 >> 62; r1 &= M62;
    r3 += r2 >> 62; r2 &= M62;
    r4 += r3 >> 62; r3 &= M62;

    r->v[0] = r0;
    r->v[1] = r1;
    r->v[2] = r2;
    r->v[3] = r3;
    r->v[4] = r4;

    VERIFY_CHECK(r0 >> 62 == 0);
    VERIFY_CHECK(r1 >> 62 == 0);
    VERIFY_CHECK(r2 >> 62 == 0);
    VERIFY_CHECK(r3 >> 62 == 0);
    VERIFY_CHECK(r4 >> 62 == 0);
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 0) >= 0); /* r >= 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 1) < 0); /* r < modulus */
}